

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeAttach(Parse *pParse,int type,FuncDef *pFunc,Expr *pAuthArg,Expr *pFilename,Expr *pDbname,
               Expr *pKey)

{
  int iVar1;
  Vdbe *pVVar2;
  char *in_RCX;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char *zAuthArg;
  int regArgs;
  sqlite3 *db;
  Vdbe *v;
  int rc;
  NameContext sName;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Parse *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 uVar3;
  char *zArg1;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  int iVar5;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0xaaaaaaaa;
  memset(local_40,0xaa,0x38);
  iVar5 = -0x55555556;
  zArg1 = (char *)*in_RDI;
  uVar3 = 0xaaaaaaaa;
  iVar1 = sqlite3ReadSchema((Parse *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if ((iVar1 == 0) && (*(int *)((long)in_RDI + 0x34) == 0)) {
    memset(local_40,0,0x38);
    iVar1 = resolveAttachExpr((NameContext *)
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              (Expr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
    ;
    if ((iVar1 == 0) &&
       ((iVar1 = resolveAttachExpr((NameContext *)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                   (Expr *)CONCAT44(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58)), iVar1 == 0 &&
        (iVar1 = resolveAttachExpr((NameContext *)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                   (Expr *)CONCAT44(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58)), iVar1 == 0)))) {
      if (in_RCX != (char *)0x0) {
        if (*in_RCX == 'v') {
          in_stack_ffffffffffffff68 = *(Parse **)(in_RCX + 8);
        }
        else {
          in_stack_ffffffffffffff68 = (Parse *)0x0;
        }
        iVar1 = sqlite3AuthCheck((Parse *)CONCAT44(uVar4,in_stack_ffffffffffffff88),iVar5,zArg1,
                                 (char *)CONCAT44(uVar3,in_stack_ffffffffffffff70),
                                 (char *)in_stack_ffffffffffffff68);
        if (iVar1 != 0) goto LAB_0021fef9;
        uVar4 = 0;
      }
      iVar5 = (int)in_RCX;
      pVVar2 = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                             );
      iVar1 = sqlite3GetTempRange(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      sqlite3ExprCode((Parse *)CONCAT44(iVar1,in_stack_ffffffffffffff70),
                      (Expr *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      sqlite3ExprCode((Parse *)CONCAT44(iVar1,in_stack_ffffffffffffff70),
                      (Expr *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      sqlite3ExprCode((Parse *)CONCAT44(iVar1,in_stack_ffffffffffffff70),
                      (Expr *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      if (pVVar2 != (Vdbe *)0x0) {
        in_stack_ffffffffffffff58 = 0;
        sqlite3VdbeAddFunctionCall
                  ((Parse *)CONCAT44(uVar4,in_stack_ffffffffffffff88),(int)((ulong)pVVar2 >> 0x20),
                   (int)pVVar2,(int)((ulong)zArg1 >> 0x20),(int)zArg1,
                   (FuncDef *)CONCAT44(iVar1,in_stack_ffffffffffffff70),iVar5);
        sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      }
    }
  }
LAB_0021fef9:
  sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (Expr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (Expr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (Expr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void codeAttach(
  Parse *pParse,       /* The parser context */
  int type,            /* Either SQLITE_ATTACH or SQLITE_DETACH */
  FuncDef const *pFunc,/* FuncDef wrapper for detachFunc() or attachFunc() */
  Expr *pAuthArg,      /* Expression to pass to authorization callback */
  Expr *pFilename,     /* Name of database file */
  Expr *pDbname,       /* Name of the database to use internally */
  Expr *pKey           /* Database key for encryption extension */
){
  int rc;
  NameContext sName;
  Vdbe *v;
  sqlite3* db = pParse->db;
  int regArgs;

  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ) goto attach_end;

  if( pParse->nErr ) goto attach_end;
  memset(&sName, 0, sizeof(NameContext));
  sName.pParse = pParse;

  if(
      SQLITE_OK!=resolveAttachExpr(&sName, pFilename) ||
      SQLITE_OK!=resolveAttachExpr(&sName, pDbname) ||
      SQLITE_OK!=resolveAttachExpr(&sName, pKey)
  ){
    goto attach_end;
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( ALWAYS(pAuthArg) ){
    char *zAuthArg;
    if( pAuthArg->op==TK_STRING ){
      assert( !ExprHasProperty(pAuthArg, EP_IntValue) );
      zAuthArg = pAuthArg->u.zToken;
    }else{
      zAuthArg = 0;
    }
    rc = sqlite3AuthCheck(pParse, type, zAuthArg, 0, 0);
    if(rc!=SQLITE_OK ){
      goto attach_end;
    }
  }
#endif /* SQLITE_OMIT_AUTHORIZATION */


  v = sqlite3GetVdbe(pParse);
  regArgs = sqlite3GetTempRange(pParse, 4);
  sqlite3ExprCode(pParse, pFilename, regArgs);
  sqlite3ExprCode(pParse, pDbname, regArgs+1);
  sqlite3ExprCode(pParse, pKey, regArgs+2);

  assert( v || db->mallocFailed );
  if( v ){
    sqlite3VdbeAddFunctionCall(pParse, 0, regArgs+3-pFunc->nArg, regArgs+3,
                               pFunc->nArg, pFunc, 0);
    /* Code an OP_Expire. For an ATTACH statement, set P1 to true (expire this
    ** statement only). For DETACH, set it to false (expire all existing
    ** statements).
    */
    sqlite3VdbeAddOp1(v, OP_Expire, (type==SQLITE_ATTACH));
  }

attach_end:
  sqlite3ExprDelete(db, pFilename);
  sqlite3ExprDelete(db, pDbname);
  sqlite3ExprDelete(db, pKey);
}